

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_instance.cpp
# Opt level: O0

uint __thiscall ON_InstanceDefinition::SizeOf(ON_InstanceDefinition *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint sz;
  ON_InstanceDefinition *this_local;
  
  uVar1 = ON_ModelComponent::SizeOf(&this->super_ON_ModelComponent);
  uVar2 = ON_SimpleArray<ON_UUID_struct>::SizeOfArray(&this->m_object_uuid);
  uVar3 = ON_wString::SizeOf(&this->m_description);
  uVar4 = ON_wString::SizeOf(&this->m_url);
  uVar5 = ON_wString::SizeOf(&this->m_url_tag);
  uVar6 = ON_FileReference::SizeOf(&this->m_linked_file_reference);
  return uVar6 + uVar5 + uVar4 + uVar3 + uVar2 + uVar1 + 0x228;
}

Assistant:

unsigned int ON_InstanceDefinition::SizeOf() const
{
  unsigned int sz = sizeof(*this) - sizeof(ON_Geometry);
  sz += ON_ModelComponent::SizeOf();
  sz += this->m_object_uuid.SizeOfArray();
  sz += this->m_description.SizeOf();
  sz += this->m_url.SizeOf();
  sz += this->m_url_tag.SizeOf();
  sz += this->m_linked_file_reference.SizeOf();
  return sz;
}